

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRenderRule * __thiscall QRenderRule::operator=(QRenderRule *this,QRenderRule *param_2)

{
  QBrush *in_RSI;
  QRenderRule *in_RDI;
  QSharedDataPointer<QStyleSheetOutlineData> *unaff_retaddr;
  QRenderRule *other;
  
  in_RDI->features = *(int *)in_RSI;
  other = in_RDI;
  QBrush::operator=(in_RSI,(QBrush *)in_RDI);
  QFont::operator=((QFont *)in_RSI,(QFont *)in_RDI);
  in_RDI->hasFont = (bool)((byte)((QFont *)in_RSI)[0x20] & 1);
  QHash<QString,_QVariant>::operator=
            ((QHash<QString,_QVariant> *)unaff_retaddr,(QHash<QString,_QVariant> *)other);
  QSharedDataPointer<QStyleSheetPaletteData>::operator=
            ((QSharedDataPointer<QStyleSheetPaletteData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetPaletteData> *)other);
  QSharedDataPointer<QStyleSheetBoxData>::operator=
            ((QSharedDataPointer<QStyleSheetBoxData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetBoxData> *)other);
  QSharedDataPointer<QStyleSheetBackgroundData>::operator=
            ((QSharedDataPointer<QStyleSheetBackgroundData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetBackgroundData> *)other);
  QSharedDataPointer<QStyleSheetBorderData>::operator=
            ((QSharedDataPointer<QStyleSheetBorderData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetBorderData> *)other);
  QSharedDataPointer<QStyleSheetOutlineData>::operator=
            (unaff_retaddr,(QSharedDataPointer<QStyleSheetOutlineData> *)other);
  QSharedDataPointer<QStyleSheetGeometryData>::operator=
            ((QSharedDataPointer<QStyleSheetGeometryData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetGeometryData> *)other);
  QSharedDataPointer<QStyleSheetPositionData>::operator=
            ((QSharedDataPointer<QStyleSheetPositionData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetPositionData> *)other);
  QSharedDataPointer<QStyleSheetImageData>::operator=
            ((QSharedDataPointer<QStyleSheetImageData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetImageData> *)other);
  QSharedDataPointer<QStyleSheetImageData>::operator=
            ((QSharedDataPointer<QStyleSheetImageData> *)unaff_retaddr,
             (QSharedDataPointer<QStyleSheetImageData> *)other);
  in_RDI->clipset = *(int *)((QPainterPath *)in_RSI + 0x78);
  QPainterPath::operator=((QPainterPath *)in_RSI,(QPainterPath *)in_RDI);
  return in_RDI;
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }